

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void yyStackOverflow(yyParser *yypParser)

{
  ulong *in_RDI;
  Parse *pParse;
  yyParser *pParser;
  
  pParser = (yyParser *)in_RDI[1];
  while (in_RDI[3] < *in_RDI) {
    yy_pop_parser_stack(pParser);
  }
  sqlite3OomFault((sqlite3 *)pParser);
  in_RDI[1] = (ulong)pParser;
  return;
}

Assistant:

static void yyStackOverflow(yyParser *yypParser){
   sqlite3ParserARG_FETCH
   sqlite3ParserCTX_FETCH
#ifndef NDEBUG
   if( yyTraceFILE ){
     fprintf(yyTraceFILE,"%sStack Overflow!\n",yyTracePrompt);
   }
#endif
   while( yypParser->yytos>yypParser->yystack ) yy_pop_parser_stack(yypParser);
   /* Here code is inserted which will execute if the parser
   ** stack every overflows */
/******** Begin %stack_overflow code ******************************************/

  sqlite3OomFault(pParse->db);
/******** End %stack_overflow code ********************************************/
   sqlite3ParserARG_STORE /* Suppress warning about unused %extra_argument var */
   sqlite3ParserCTX_STORE
}